

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.h
# Opt level: O3

WeakHandle<polyscope::Widget> * __thiscall
polyscope::WeakReferrable::getWeakHandle<polyscope::Widget>
          (WeakHandle<polyscope::Widget> *__return_storage_ptr__,WeakReferrable *this,
          Widget *targetPtr)

{
  element_type *peVar1;
  Widget *pWVar2;
  uint64_t uVar3;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  
  if (targetPtr == (Widget *)0x0) {
    pWVar2 = (Widget *)__dynamic_cast(this,&typeinfo,&Widget::typeinfo,0xffffffffffffffff);
    if (pWVar2 == (Widget *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"[Polyscope] bad getWeakHandle() cast");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar1 = (this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_01 = (this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uVar3 = this->weakReferableUniqueID;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super_GenericWeakHandle).targetUniqueID = uVar3;
      __return_storage_ptr__->targetPtr = pWVar2;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      bVar4 = __libc_single_threaded != '\0';
      uVar3 = this->weakReferableUniqueID;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
      if (bVar4) goto LAB_002014d4;
      LOCK();
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
      uVar3 = this->weakReferableUniqueID;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
LAB_002014d4:
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
    }
    (__return_storage_ptr__->super_GenericWeakHandle).targetUniqueID = uVar3;
    __return_storage_ptr__->targetPtr = pWVar2;
    goto LAB_002014df;
  }
  peVar1 = (this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  this_01 = (this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar3 = this->weakReferableUniqueID;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->super_GenericWeakHandle).targetUniqueID = uVar3;
    __return_storage_ptr__->targetPtr = targetPtr;
    return __return_storage_ptr__;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded != '\0';
    uVar3 = this->weakReferableUniqueID;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
    if (bVar4) goto LAB_0020149a;
    LOCK();
    this_01->_M_weak_count = this_01->_M_weak_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
    uVar3 = this->weakReferableUniqueID;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->super_GenericWeakHandle).sentinel.
    super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
LAB_0020149a:
    this_01->_M_weak_count = this_01->_M_weak_count + 1;
  }
  (__return_storage_ptr__->super_GenericWeakHandle).targetUniqueID = uVar3;
  __return_storage_ptr__->targetPtr = targetPtr;
LAB_002014df:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return __return_storage_ptr__;
}

Assistant:

WeakHandle<TargetType> getWeakHandle(TargetType* targetPtr = nullptr) {

    // in the case where we already had a pointer to the target type, just directly generate the wrapper
    if (targetPtr) {
      return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
    }

    // otherwise, dynamic_cast to resolve the desired type
    targetPtr = dynamic_cast<TargetType*>(this); // sorry, world
    if (!targetPtr) throw std::runtime_error("[Polyscope] bad getWeakHandle() cast");
    return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
  }